

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::TestMutualRecursionA_SubGroup::_InternalSerialize
          (TestMutualRecursionA_SubGroup *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TestMutualRecursionA_SubMessage *value;
  TestAllTypes *value_00;
  bool bVar2;
  int iVar3;
  uint32_t *puVar4;
  UnknownFieldSet *unknown_fields;
  uint32_t cached_has_bits;
  TestMutualRecursionA_SubGroup *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestMutualRecursionA_SubGroup *this_local;
  
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.sub_message_;
    iVar3 = TestMutualRecursionA_SubMessage::GetCachedSize((this->field_0)._impl_.sub_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (3,(MessageLite *)value,iVar3,target,stream);
  }
  if ((uVar1 & 2) != 0) {
    value_00 = (this->field_0)._impl_.not_in_this_scc_;
    iVar3 = edition_unittest::TestAllTypes::GetCachedSize((this->field_0)._impl_.not_in_this_scc_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (4,(MessageLite *)value_00,iVar3,(uint8_t *)stream_local,stream);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar2) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMutualRecursionA_SubGroup::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMutualRecursionA_SubGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestMutualRecursionA.SubGroup)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.TestMutualRecursionA.SubMessage sub_message = 3;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.sub_message_, this_._impl_.sub_message_->GetCachedSize(), target,
        stream);
  }

  // .edition_unittest.TestAllTypes not_in_this_scc = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.not_in_this_scc_, this_._impl_.not_in_this_scc_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestMutualRecursionA.SubGroup)
  return target;
}